

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int32_t intersect_vector16_cardinality(uint16_t *A,size_t s_a,uint16_t *B,size_t s_b)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong in_RCX;
  undefined1 (*in_RDX) [16];
  ulong in_RSI;
  undefined1 (*in_RDI) [16];
  bool bVar7;
  size_t i_a;
  size_t count;
  undefined4 local_d8;
  undefined4 local_b8;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  uint16_t b;
  uint16_t a;
  uint16_t b_max_1;
  uint16_t a_max_1;
  int r_1;
  __m128i res_v_1;
  uint16_t b_max;
  uint16_t a_max;
  int r;
  __m128i res_v;
  __m128i v_b;
  __m128i v_a;
  size_t st_b;
  size_t st_a;
  int vectorlength;
  size_t i_b;
  
  iVar2 = 0;
  res_v_1[1] = 0;
  res_v_1[0] = 0;
  uVar3 = in_RSI & 0xfffffffffffffff8;
  uVar4 = in_RCX & 0xfffffffffffffff8;
  uVar6 = res_v_1[0];
  uVar5 = res_v_1[1];
  if ((uVar3 != 0) && (uVar4 != 0)) {
    local_98 = vlddqu_avx(*in_RDI);
    local_a8 = vlddqu_avx(*in_RDX);
LAB_001025a4:
    bVar7 = true;
    if (*(short *)(*in_RDI + res_v_1[1] * 2) != 0) {
      bVar7 = *(short *)(*in_RDX + res_v_1[0] * 2) == 0;
    }
    uVar6 = res_v_1[0];
    uVar5 = res_v_1[1];
    if (!bVar7) goto LAB_001026f6;
    vpcmpestrm_avx(local_a8,local_98,1);
    local_b8 = local_a8._0_4_;
    iVar2 = POPCOUNT(local_b8) + iVar2;
    lVar1 = res_v_1[1] * 2;
    if (*(ushort *)(*in_RDI + lVar1 + 0xe) <= *(ushort *)(*in_RDX + res_v_1[0] * 2 + 0xe)) {
      uVar5 = res_v_1[1] + 8;
      if (uVar5 == uVar3) goto LAB_001026f6;
      local_98 = vlddqu_avx(*(undefined1 (*) [16])(in_RDI[1] + res_v_1[1] * 2));
      res_v_1[1] = uVar5;
    }
    if (*(ushort *)(*in_RDX + res_v_1[0] * 2 + 0xe) <= *(ushort *)(*in_RDI + lVar1 + 0xe)) {
      uVar6 = res_v_1[0] + 8;
      uVar5 = res_v_1[1];
      if (uVar6 == uVar4) goto LAB_001026f6;
      local_a8 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX[1] + res_v_1[0] * 2));
      res_v_1[0] = uVar6;
    }
    goto LAB_001025a4;
  }
  goto LAB_0010282b;
LAB_001026f6:
  res_v_1[1] = uVar5;
  res_v_1[0] = uVar6;
  uVar6 = res_v_1[0];
  uVar5 = res_v_1[1];
  if (((ulong)res_v_1[1] < uVar3) && ((ulong)res_v_1[0] < uVar4)) {
LAB_00102717:
    vpcmpistrm_avx(local_a8,local_98,1);
    local_d8 = local_a8._0_4_;
    iVar2 = POPCOUNT(local_d8) + iVar2;
    lVar1 = res_v_1[1] * 2;
    if (*(ushort *)(*in_RDI + lVar1 + 0xe) <= *(ushort *)(*in_RDX + res_v_1[0] * 2 + 0xe)) {
      uVar5 = res_v_1[1] + 8;
      uVar6 = res_v_1[0];
      if (uVar5 == uVar3) goto LAB_0010282b;
      local_98 = vlddqu_avx(*(undefined1 (*) [16])(in_RDI[1] + res_v_1[1] * 2));
      res_v_1[1] = uVar5;
    }
    if (*(ushort *)(*in_RDX + res_v_1[0] * 2 + 0xe) <= *(ushort *)(*in_RDI + lVar1 + 0xe)) {
      uVar6 = res_v_1[0] + 8;
      uVar5 = res_v_1[1];
      if (uVar6 == uVar4) goto LAB_0010282b;
      local_a8 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX[1] + res_v_1[0] * 2));
      res_v_1[0] = uVar6;
    }
    goto LAB_00102717;
  }
LAB_0010282b:
  while (res_v_1[1] = uVar5, res_v_1[0] = uVar6,
        (ulong)res_v_1[1] < in_RSI && (ulong)res_v_1[0] < in_RCX) {
    if (*(ushort *)(*in_RDI + res_v_1[1] * 2) < *(ushort *)(*in_RDX + res_v_1[0] * 2)) {
      uVar6 = res_v_1[0];
      uVar5 = res_v_1[1] + 1;
    }
    else {
      if (*(ushort *)(*in_RDI + res_v_1[1] * 2) <= *(ushort *)(*in_RDX + res_v_1[0] * 2)) {
        iVar2 = iVar2 + 1;
        res_v_1[1] = res_v_1[1] + 1;
      }
      res_v_1[0] = res_v_1[0] + 1;
      uVar6 = res_v_1[0];
      uVar5 = res_v_1[1];
    }
  }
  return iVar2;
}

Assistant:

int32_t intersect_vector16_cardinality(const uint16_t *__restrict__ A,
                                       size_t s_a,
                                       const uint16_t *__restrict__ B,
                                       size_t s_b) {
    size_t count = 0;
    size_t i_a = 0, i_b = 0;
    const int vectorlength = sizeof(__m128i) / sizeof(uint16_t);
    const size_t st_a = (s_a / vectorlength) * vectorlength;
    const size_t st_b = (s_b / vectorlength) * vectorlength;
    __m128i v_a, v_b;
    if ((i_a < st_a) && (i_b < st_b)) {
        v_a = _mm_lddqu_si128((__m128i *)&A[i_a]);
        v_b = _mm_lddqu_si128((__m128i *)&B[i_b]);
        while ((A[i_a] == 0) || (B[i_b] == 0)) {
            const __m128i res_v = _mm_cmpestrm(
                v_b, vectorlength, v_a, vectorlength,
                _SIDD_UWORD_OPS | _SIDD_CMP_EQUAL_ANY | _SIDD_BIT_MASK);
            const int r = _mm_extract_epi32(res_v, 0);
            count += _mm_popcnt_u32(r);
            const uint16_t a_max = A[i_a + vectorlength - 1];
            const uint16_t b_max = B[i_b + vectorlength - 1];
            if (a_max <= b_max) {
                i_a += vectorlength;
                if (i_a == st_a) break;
                v_a = _mm_lddqu_si128((__m128i *)&A[i_a]);
            }
            if (b_max <= a_max) {
                i_b += vectorlength;
                if (i_b == st_b) break;
                v_b = _mm_lddqu_si128((__m128i *)&B[i_b]);
            }
        }
        if ((i_a < st_a) && (i_b < st_b))
            while (true) {
                const __m128i res_v = _mm_cmpistrm(
                    v_b, v_a,
                    _SIDD_UWORD_OPS | _SIDD_CMP_EQUAL_ANY | _SIDD_BIT_MASK);
                const int r = _mm_extract_epi32(res_v, 0);
                count += _mm_popcnt_u32(r);
                const uint16_t a_max = A[i_a + vectorlength - 1];
                const uint16_t b_max = B[i_b + vectorlength - 1];
                if (a_max <= b_max) {
                    i_a += vectorlength;
                    if (i_a == st_a) break;
                    v_a = _mm_lddqu_si128((__m128i *)&A[i_a]);
                }
                if (b_max <= a_max) {
                    i_b += vectorlength;
                    if (i_b == st_b) break;
                    v_b = _mm_lddqu_si128((__m128i *)&B[i_b]);
                }
            }
    }
    // intersect the tail using scalar intersection
    while (i_a < s_a && i_b < s_b) {
        uint16_t a = A[i_a];
        uint16_t b = B[i_b];
        if (a < b) {
            i_a++;
        } else if (b < a) {
            i_b++;
        } else {
            count++;
            i_a++;
            i_b++;
        }
    }
    return (int32_t)count;
}